

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3Fts5MallocZero(int *pRc,sqlite3_int64 nByte)

{
  int iVar1;
  void *pvVar2;
  
  if (*pRc == 0) {
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      pvVar2 = sqlite3Malloc(nByte);
    }
    else {
      pvVar2 = (void *)0x0;
    }
    if (pvVar2 != (void *)0x0) {
      pvVar2 = memset(pvVar2,0,nByte);
      return pvVar2;
    }
    if (0 < nByte) {
      *pRc = 7;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *sqlite3Fts5MallocZero(int *pRc, sqlite3_int64 nByte){
  void *pRet = 0;
  if( *pRc==SQLITE_OK ){
    pRet = sqlite3_malloc64(nByte);
    if( pRet==0 ){
      if( nByte>0 ) *pRc = SQLITE_NOMEM;
    }else{
      memset(pRet, 0, (size_t)nByte);
    }
  }
  return pRet;
}